

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.h
# Opt level: O1

void __thiscall
highwayhash::HighwayHashCatT<4U>::Finalize<unsigned_long>
          (HighwayHashCatT<4U> *this,unsigned_long *hash)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  V4x32U packetH;
  V4x32U packetL;
  HHStateAVX2 local_e0;
  V4x32U local_60;
  V4x32U local_50 [4];
  undefined1 auVar12 [32];
  
  local_e0.v0.v_ = *&(this->state_).v0.v_;
  local_e0.v1.v_ = *&(this->state_).v1.v_;
  local_e0.mul0.v_ = *&(this->state_).mul0.v_;
  local_e0.mul1.v_ = *&(this->state_).mul1.v_;
  uVar1 = this->buffer_usage_;
  if (uVar1 != 0) {
    uVar4 = (uint)uVar1;
    auVar11._4_4_ = uVar4;
    auVar11._0_4_ = uVar4;
    auVar11._8_4_ = uVar4;
    auVar11._12_4_ = uVar4;
    auVar12._16_4_ = uVar4;
    auVar12._0_16_ = auVar11;
    auVar12._20_4_ = uVar4;
    auVar12._24_4_ = uVar4;
    auVar12._28_4_ = uVar4;
    local_e0.v0.v_ = (Intrinsic)vpaddq_avx2(local_e0.v0.v_,auVar12);
    auVar9 = vpsllvd_avx2((undefined1  [32])local_e0.v1.v_,auVar12);
    auVar7._8_4_ = 0x20;
    auVar7._0_8_ = 0x2000000020;
    auVar7._12_4_ = 0x20;
    auVar7._16_4_ = 0x20;
    auVar7._20_4_ = 0x20;
    auVar7._24_4_ = 0x20;
    auVar7._28_4_ = 0x20;
    auVar12 = vpsubd_avx2(auVar7,auVar12);
    auVar12 = vpsrlvd_avx2((undefined1  [32])local_e0.v1.v_,auVar12);
    local_e0.v1.v_ = (Intrinsic)vpor_avx2(auVar12,auVar9);
    pcVar5 = this->buffer_ + (uVar1 & 0xfffffffffffffffc);
    uVar6 = (ulong)(uVar4 & 3);
    if ((uVar1 & 0x10) == 0) {
      auVar11 = vpcmpgtd_avx(auVar11,_DAT_00112220);
      auVar11 = vpand_avx(auVar11,*(undefined1 (*) [16])this->buffer_);
      if (uVar6 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (uint)CONCAT12(pcVar5[uVar6 - 1],CONCAT11(pcVar5[(uVar4 & 3) >> 1],*pcVar5));
      }
      auVar9._0_16_ = ZEXT116(0) * ZEXT416(uVar4) + ZEXT116(1) * auVar11;
      auVar9._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * ZEXT416(uVar4);
      auVar12 = vpaddq_avx2((undefined1  [32])local_e0.mul0.v_,(undefined1  [32])local_e0.v1.v_);
      auVar12 = vpaddq_avx2(auVar12,auVar9);
      auVar9 = vpsrlq_avx2((undefined1  [32])local_e0.v0.v_,0x20);
      auVar9 = vpmuludq_avx2(auVar12,auVar9);
      local_e0.mul0.v_ = auVar9 ^ local_e0.mul0.v_;
      auVar9 = vpaddq_avx2((undefined1  [32])local_e0.mul1.v_,(undefined1  [32])local_e0.v0.v_);
      auVar7 = vpsrlq_avx2(auVar12,0x20);
      auVar7 = vpmuludq_avx2(auVar7,auVar9);
      local_e0.mul1.v_ = auVar7 ^ local_e0.mul1.v_;
      auVar10._16_16_ = _DAT_00112230;
      auVar10._0_16_ = _DAT_00112230;
      auVar7 = vpshufb_avx2(auVar12,auVar10);
      local_e0.v0.v_ = (Intrinsic)vpaddq_avx2(auVar7,auVar9);
      auVar9 = vpshufb_avx2((undefined1  [32])local_e0.v0.v_,auVar10);
      local_e0.v1.v_ = (Intrinsic)vpaddq_avx2(auVar9,auVar12);
    }
    else {
      local_50[0].v_[0] = *(longlong *)this->buffer_;
      local_50[0].v_[1] = *(longlong *)(this->buffer_ + 8);
      auVar11 = vpcmpgtd_avx(auVar11,_DAT_00112210);
      auVar11 = vpand_avx(auVar11,*(undefined1 (*) [16])(this->buffer_ + 0x10));
      local_60.v_ = (Intrinsic)vpinsrd_avx(auVar11,*(undefined4 *)(pcVar5 + (uVar6 - 4)),3);
      AVX2::HHStateAVX2::Update(&local_e0,&local_60,local_50);
    }
  }
  auVar12 = vpshufd_avx2((undefined1  [32])local_e0.v0.v_,0xb1);
  auVar12 = vpermq_avx2(auVar12,0x4e);
  auVar12 = vpaddq_avx2(auVar12,(undefined1  [32])local_e0.v1.v_);
  auVar12 = vpaddq_avx2((undefined1  [32])local_e0.mul0.v_,auVar12);
  auVar9 = vpsrlq_avx2((undefined1  [32])local_e0.v0.v_,0x20);
  auVar10 = vpmuludq_avx2(auVar9,auVar12);
  auVar9 = vpaddq_avx2((undefined1  [32])local_e0.mul1.v_,(undefined1  [32])local_e0.v0.v_);
  auVar7 = vpsrlq_avx2(auVar12,0x20);
  auVar2 = vpmuludq_avx2(auVar7,auVar9);
  auVar8._16_16_ = _DAT_00112230;
  auVar8._0_16_ = _DAT_00112230;
  auVar7 = vpshufb_avx2(auVar12,auVar8);
  auVar9 = vpaddq_avx2(auVar7,auVar9);
  auVar7 = vpshufb_avx2(auVar9,auVar8);
  auVar12 = vpaddq_avx2(auVar7,auVar12);
  auVar7 = vpshufd_avx2(auVar9,0xb1);
  auVar7 = vpermq_avx2(auVar7,0x4e);
  auVar7 = vpaddq_avx2(auVar7,auVar10 ^ (undefined1  [32])local_e0.mul0.v_);
  auVar12 = vpaddq_avx2(auVar12,auVar7);
  auVar7 = vpsrlq_avx2(auVar9,0x20);
  auVar3 = vpmuludq_avx2(auVar7,auVar12);
  auVar3 = auVar3 ^ auVar10 ^ (undefined1  [32])local_e0.mul0.v_;
  auVar9 = vpaddq_avx2(auVar2 ^ (undefined1  [32])local_e0.mul1.v_,auVar9);
  auVar7 = vpsrlq_avx2(auVar12,0x20);
  auVar10 = vpmuludq_avx2(auVar7,auVar9);
  auVar10 = auVar10 ^ auVar2 ^ (undefined1  [32])local_e0.mul1.v_;
  auVar7 = vpshufb_avx2(auVar12,auVar8);
  auVar9 = vpaddq_avx2(auVar7,auVar9);
  auVar7 = vpshufb_avx2(auVar9,auVar8);
  auVar12 = vpaddq_avx2(auVar7,auVar12);
  auVar7 = vpshufd_avx2(auVar9,0xb1);
  auVar7 = vpermq_avx2(auVar7,0x4e);
  auVar7 = vpaddq_avx2(auVar7,auVar3);
  auVar12 = vpaddq_avx2(auVar12,auVar7);
  auVar7 = vpsrlq_avx2(auVar9,0x20);
  auVar2 = vpmuludq_avx2(auVar7,auVar12);
  auVar2 = auVar2 ^ auVar3;
  auVar9 = vpaddq_avx2(auVar10,auVar9);
  auVar7 = vpsrlq_avx2(auVar12,0x20);
  auVar3 = vpmuludq_avx2(auVar7,auVar9);
  auVar3 = auVar3 ^ auVar10;
  auVar7 = vpshufb_avx2(auVar12,auVar8);
  auVar9 = vpaddq_avx2(auVar7,auVar9);
  auVar7 = vpshufb_avx2(auVar9,auVar8);
  auVar12 = vpaddq_avx2(auVar7,auVar12);
  auVar7 = vpshufd_avx2(auVar9,0xb1);
  auVar7 = vpermq_avx2(auVar7,0x4e);
  auVar7 = vpaddq_avx2(auVar7,auVar2);
  auVar12 = vpaddq_avx2(auVar12,auVar7);
  auVar7 = vpsrlq_avx2(auVar9,0x20);
  auVar7 = vpmuludq_avx2(auVar7,auVar12);
  local_e0.mul0.v_[0] = auVar7._0_8_ ^ auVar2._0_8_;
  auVar9 = vpaddq_avx2(auVar3,auVar9);
  auVar7 = vpsrlq_avx2(auVar12,0x20);
  auVar7 = vpmuludq_avx2(auVar7,auVar9);
  local_e0.mul1.v_[0] = auVar7._0_8_ ^ auVar3._0_8_;
  auVar7 = vpshufb_avx2(auVar12,auVar8);
  auVar9 = vpaddq_avx2(auVar7,auVar9);
  auVar7 = vpshufb_avx2(auVar9,auVar8);
  auVar12 = vpaddq_avx2(auVar7,auVar12);
  *hash = auVar9._0_8_ + local_e0.mul0.v_[0] + local_e0.mul1.v_[0] + auVar12._0_8_;
  return;
}

Assistant:

HH_INLINE void Finalize(Result* HH_RESTRICT hash) const {
    // BeginIACA();
    HHStateT<Target> state_copy = state_;
    const size_t buffer_usage = buffer_usage_;
    if (HH_LIKELY(buffer_usage != 0)) {
      state_copy.UpdateRemainder(buffer_, buffer_usage);
    }
    state_copy.Finalize(hash);
    // EndIACA();
  }